

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::Matcher<fmt::v5::basic_string_view<char>_>::Matcher
          (Matcher<fmt::v5::basic_string_view<char>_> *this,basic_string_view<char> value)

{
  linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_> local_38;
  
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.value_ =
       (MatcherInterface<fmt::v5::basic_string_view<char>_> *)0x0;
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.link_.next_ =
       &(this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_.link_;
  (this->super_MatcherBase<fmt::v5::basic_string_view<char>_>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001d9908;
  local_38.value_ = (MatcherInterface<fmt::v5::basic_string_view<char>_> *)operator_new(0x18);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d9ac8;
  local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value.data_;
  local_38.value_[2].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)value.size_;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_>::
  operator=(&(this->super_MatcherBase<fmt::v5::basic_string_view<char>_>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<fmt::v5::basic_string_view<char>_>_>::
  ~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }